

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<unsigned_int,_3UL>_> *value)

{
  bool bVar1;
  uint3 v;
  array<unsigned_int,_3UL> local_24;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<unsigned_int,3ul>(this,&local_24);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<unsigned_int,3ul>>::operator=
                ((optional<std::array<unsigned_int,3ul>> *)value,&local_24);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::uint3> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::uint3 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}